

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_copy_comp2img(fitsfile *infptr,fitsfile *outfptr,int norec,int *status)

{
  int iVar1;
  char *local_548;
  char *spkeys [22] [2];
  char *reqkeys [11] [2];
  int local_32c;
  int local_328;
  int nmore;
  int nkeys;
  int tstatus;
  int nsp;
  int nreq;
  int npat;
  int jj;
  int ii;
  char negative [2];
  char *patterns [40] [2];
  char card [81];
  int *status_local;
  int norec_local;
  fitsfile *outfptr_local;
  fitsfile *infptr_local;
  
  jj._2_2_ = 0x2d;
  nmore = 0;
  memcpy(spkeys[0x15] + 1,&DAT_002b7720,0xb0);
  memcpy(&local_548,&DAT_002b77d0,0x160);
  if (*status < 1) {
    tstatus = 0xb;
    nkeys = 0x16;
    for (npat = 0; npat < 0xb; npat = npat + 1) {
      *(char **)(&ii + (long)npat * 4) = spkeys[(long)npat + 0x15][1];
      if (norec == 0) {
        patterns[npat][0] = reqkeys[npat][0];
      }
      else {
        patterns[npat][0] = (char *)((long)&jj + 2);
      }
    }
    for (npat = 0; npat < 0x16; npat = npat + 1) {
      *(char **)(&ii + (long)(npat + 0xb) * 4) = spkeys[(long)npat + -1][1];
      patterns[npat + 0xb][0] = spkeys[npat][0];
    }
    nsp = 0x21;
    ffgcrd(infptr,"EXTNAME",(char *)(patterns[0x27] + 1),&nmore);
    if ((nmore == 0) &&
       (iVar1 = strncmp((char *)(patterns[0x27] + 1),"EXTNAME = \'COMPRESSED_IMAGE\'",0x1c),
       iVar1 == 0)) {
      patterns[nsp + -2][0] = (char *)((long)&jj + 2);
    }
    fits_translate_keywords(infptr,outfptr,1,(char *(*) [2])&ii,nsp,0,0,0,status);
    ffghsp(infptr,&local_328,&local_32c,status);
    local_32c = local_32c / 0x24;
    for (nreq = 0; nreq < local_32c; nreq = nreq + 1) {
      for (npat = 0; npat < 0x24; npat = npat + 1) {
        ffprec(outfptr,"    ",status);
      }
    }
    infptr_local._4_4_ = *status;
  }
  else {
    infptr_local._4_4_ = *status;
  }
  return infptr_local._4_4_;
}

Assistant:

int imcomp_copy_comp2img(fitsfile *infptr, fitsfile *outfptr, 
                          int norec, int *status)
/*
    This routine copies the header keywords from the compressed input image 
    and to the uncompressed image (in a binary table) 
*/
{
    char card[FLEN_CARD];	/* a header record */
    char *patterns[40][2];
    char negative[] = "-";
    int ii,jj, npat, nreq, nsp, tstatus = 0;
    int nkeys, nmore;
    
    /* tile compressed image keyword translation table  */
    /*                        INPUT      OUTPUT  */
    /*                       01234567   01234567 */

    /*  only translate these if required keywords not already written */
    char *reqkeys[][2] = {  
			   {"ZSIMPLE",   "SIMPLE" },  
			   {"ZTENSION", "XTENSION"},
			   {"ZBITPIX",   "BITPIX" },
			   {"ZNAXIS",    "NAXIS"  },
			   {"ZNAXISm",   "NAXISm" },
			   {"ZEXTEND",   "EXTEND" },
			   {"ZBLOCKED",  "BLOCKED"},
			   {"ZPCOUNT",   "PCOUNT" },  
			   {"ZGCOUNT",   "GCOUNT" },
			   {"ZHECKSUM",  "CHECKSUM"},  /* restore original checksums */
			   {"ZDATASUM",  "DATASUM"}}; 

    /* other special keywords */
    char *spkeys[][2] = {
			   {"XTENSION", "-"      },
			   {"BITPIX",  "-"       },
			   {"NAXIS",   "-"       },
			   {"NAXISm",  "-"       },
			   {"PCOUNT",  "-"       },
			   {"GCOUNT",  "-"       },
			   {"TFIELDS", "-"       },
			   {"TTYPEm",  "-"       },
			   {"TFORMm",  "-"       },
			   {"THEAP",   "-"       },
			   {"ZIMAGE",  "-"       },
			   {"ZQUANTIZ", "-"      },
			   {"ZDITHER0", "-"      },
			   {"ZTILEm",  "-"       },
			   {"ZCMPTYPE", "-"      },
			   {"ZBLANK",  "-"       },
			   {"ZNAMEm",  "-"       },
			   {"ZVALm",   "-"       },

			   {"CHECKSUM","-"       },  /* delete checksums */
			   {"DATASUM", "-"       },
			   {"EXTNAME", "+"       },  /* we may change this, below */
			   {"*",       "+"      }};  


    if (*status > 0)
        return(*status);
	
    nreq = sizeof(reqkeys)/sizeof(reqkeys[0][0])/2;
    nsp = sizeof(spkeys)/sizeof(spkeys[0][0])/2;

    /* construct translation patterns */

    for (ii = 0; ii < nreq; ii++) {
        patterns[ii][0] = reqkeys[ii][0];
	
        if (norec) 
            patterns[ii][1] = negative;
        else
            patterns[ii][1] = reqkeys[ii][1];
    }
    
    for (ii = 0; ii < nsp; ii++) {
        patterns[ii+nreq][0] = spkeys[ii][0];
        patterns[ii+nreq][1] = spkeys[ii][1];
    }

    npat = nreq + nsp;
    
    /* see if the EXTNAME keyword should be copied or not */
    fits_read_card(infptr, "EXTNAME", card, &tstatus);

    if (tstatus == 0) {
      if (!strncmp(card, "EXTNAME = 'COMPRESSED_IMAGE'", 28)) 
        patterns[npat-2][1] = negative;
    }
    
    /* translate and copy the keywords from the input file to the output */
    fits_translate_keywords(infptr, outfptr, 1, patterns, npat,
			    0, 0, 0, status);

    ffghsp(infptr, &nkeys, &nmore, status); /* get number of keywords in image */

    nmore = nmore / 36;  /* how many completely empty header blocks are there? */
     
    /* preserve the same number of spare header blocks in the output header */
     
    for (jj = 0; jj < nmore; jj++)
       for (ii = 0; ii < 36; ii++)
          fits_write_record(outfptr, "    ", status);


    return (*status);
}